

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

void __thiscall m6502::nmi(m6502 *this)

{
  byte bVar1;
  byte bVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  size_t in_RCX;
  size_t __n;
  
  if ((this->status & 4) == 0) {
    write(this,this->stackPointer | 0x100,(void *)(ulong)*(byte *)((long)&this->pc + 1),in_RCX);
    bVar1 = this->stackPointer - 1;
    this->stackPointer = bVar1;
    write(this,bVar1 | 0x100,(void *)(ulong)(byte)this->pc,in_RCX);
    bVar1 = this->status;
    bVar2 = this->stackPointer - 1;
    this->stackPointer = bVar2;
    __n = CONCAT71((int7)(in_RCX >> 8),bVar1) & 0xffffffffffffffcb | 0x24;
    this->status = (uint8_t)__n;
    write(this,bVar2 | 0x100,(void *)((ulong)bVar1 & 0xcb | 0x24),__n);
    this->stackPointer = this->stackPointer + 0xff;
    this->addrAbs = 0xfffa;
    sVar3 = read(this,0xfffa,(void *)0x0,__n);
    sVar4 = read(this,(uint)(ushort)(this->addrAbs + 1),(void *)0x0,__n);
    this->pc = (ushort)sVar3 & 0xff | (ushort)(((uint)sVar4 & 0xff) << 8);
    this->cycles = '\b';
  }
  return;
}

Assistant:

void nmi()
  {
    if (GetFlag(I) == 0)
    {
      write(0x0100u + stackPointer, (pc >> 8) & 0x00FFu);
      --stackPointer;
      write(0x0100u + stackPointer, pc & 0x00FFu);
      --stackPointer;

      SetFlag(B, 0);
      SetFlag(U, 1);
      SetFlag(I, 1);
      write(0x0100 + stackPointer, status);
      --stackPointer;

      addrAbs = 0xFFFAu;
      uint16_t lo = read(addrAbs);
      uint16_t hi = read(addrAbs + 1);
      pc = (hi << 8) | lo;

      cycles = 8;
    }
  }